

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O1

int32 nextword(char *line,char *delim,char **word,char *delimfound)

{
  char cVar1;
  char *w;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *line;
  do {
    pcVar3 = delim;
    if (cVar2 == '\0') {
      return -1;
    }
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != cVar2);
    if (cVar1 == '\0') {
      if (cVar2 == '\0') {
        return -1;
      }
      *word = line;
      break;
    }
    cVar2 = line[1];
    line = line + 1;
  } while( true );
  do {
    cVar2 = line[1];
    line = line + 1;
    pcVar3 = delim;
    if (cVar2 == '\0') break;
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != cVar2);
  } while (cVar1 == '\0');
  *delimfound = cVar2;
  *line = '\0';
  return (int)line - *(int *)word;
}

Assistant:

int32
nextword(char *line, const char *delim, char **word, char *delimfound)
{
    const char *d;
    char *w;

    /* Skip past any preceding delimiters */
    for (w = line; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (!*d)
            break;
    }
    if (!*w)
        return -1;

    *word = w;                  /* Beginning of word */

    /* Skip until first delimiter char */
    for (w++; *w; w++) {
        for (d = delim; *d && (*d != *w); d++);
        if (*d)
            break;
    }

    /* Replace delimiter with NULL char, but return the original first */
    *delimfound = *w;
    *w = '\0';

    return (w - *word);
}